

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O1

bool __thiscall ConfigReader::parseOffset(ConfigReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider __nptr;
  token_t tVar3;
  int *piVar4;
  undefined8 uVar5;
  bool bVar6;
  string tokstr;
  string g;
  string local_98;
  string local_78;
  double local_58;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  tVar3 = tokenize(this,&local_50);
  if (tVar3 == TOK_NUMBER) {
    tVar3 = tokenize(this,&local_78);
    __nptr._M_p = local_50._M_dataplus._M_p;
    if (tVar3 == TOK_SEMICOL) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      *piVar4 = 0;
      local_58 = strtod(__nptr._M_p,(char **)&local_98);
      if (local_98._M_dataplus._M_p == __nptr._M_p) {
        uVar5 = std::__throw_invalid_argument("stod");
        if ((int *)local_98._M_dataplus._M_p != piVar4) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        _Unwind_Resume(uVar5);
      }
      if (*piVar4 == 0) {
        *piVar4 = iVar2;
      }
      else if (*piVar4 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_0012aaab;
      }
      bVar6 = true;
      (*this->_vptr_ConfigReader[8])(local_58,this);
      goto LAB_0012ab3e;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Expected ;\n","");
    error(this,&local_98);
  }
  else {
LAB_0012aaab:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Expected a number for offset\n","");
    error(this,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  bVar6 = false;
LAB_0012ab3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool ConfigReader::parseOffset()
{
    // OFFSET: g 
    std::string tokstr;
    std::string g;

    // offset
    ConfigReader::token_t tok = tokenize(g);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for offset\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    double gd;
    try
    {
        gd = std::stod(g);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onOffset(gd);
    return true;
}